

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O3

bool __thiscall
bandit::detail::options::apply
          (options *this,controller_t *controller,option_map *choice,option_index index)

{
  pointer pOVar1;
  const_iterator cVar2;
  allocator local_39;
  key_type local_38;
  
  cVar2._M_node = (choice->default_it)._M_node;
  pOVar1 = (this->options_).super__Vector_base<option::Option,_std::allocator<option::Option>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pOVar1 != (pointer)0x0) && (pOVar1[index].desc != (Descriptor *)0x0)) {
    std::__cxx11::string::string((string *)&local_38,pOVar1[index].arg,&local_39);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>_>
                    *)choice,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar2._M_node == &(choice->map)._M_t._M_impl.super__Rb_tree_header) {
      return false;
    }
  }
  if (cVar2._M_node[2]._M_left != (_Base_ptr)0x0) {
    (*(code *)cVar2._M_node[2]._M_right)(cVar2._M_node + 2,controller);
    return true;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool apply(controller_t& controller, const option_map& choice, enum option_index index) const {
        option_map::map_type::const_iterator it{choice.default_it};
        if (options_[index] != nullptr) {
          it = choice.map.find(std::string(options_[index].arg));
          if (it == choice.map.end()) {
            return false;
          }
        }
        it->second(controller);
        return true;
      }